

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vumonitor.h
# Opt level: O0

double __thiscall VuMonitor::process(VuMonitor *this,double x)

{
  double x_local;
  VuMonitor *this_local;
  
  this_local = (VuMonitor *)ABS(x);
  if ((double)this_local < this->mem_ || (double)this_local == this->mem_) {
    this->mem_ = this->p_ * this->mem_;
    this_local = (VuMonitor *)((1.0 - this->p_) * (double)this_local + this->mem_);
  }
  else {
    this->mem_ = (double)this_local;
  }
  return (double)this_local;
}

Assistant:

inline double VuMonitor::process(double x)
{
    x = fabs(x);
    if (x > mem_) {
        mem_ = x;
        return x;
    }
    else {
        mem_ *= p_;
        return mem_ + (1.0 - p_) * x;
    }
}